

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O0

void test_bhdct_delete_then_insert_string_key(planck_unit_test_t *tc)

{
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  char local_81 [8];
  char key [9];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  planck_unit_test_t *tc_local;
  
  memset(local_81,0,9);
  bhdct_setup_string_key
            (tc,(ion_dictionary_handler_t *)&dict.handler,(ion_dictionary_t *)(key + 1),
             ion_fill_edge_cases);
  sprintf(local_81,"k%d",0x3c);
  bhdct_delete(tc,(ion_dictionary_t *)(key + 1),local_81,'\0',1,'\x01');
  sprintf(local_81,"k%d",4);
  bhdct_delete(tc,(ion_dictionary_t *)(key + 1),local_81,'\0',1,'\x01');
  sprintf(local_81,"k%d",0x1f9);
  bhdct_delete(tc,(ion_dictionary_t *)(key + 1),local_81,'\0',1,'\x01');
  sprintf(local_81,"k%d",0x3d);
  local_88 = 0x2c;
  bhdct_insert(tc,(ion_dictionary_t *)(key + 1),local_81,&local_88,'\x01');
  sprintf(local_81,"k%d",0x43);
  local_8c = 0x2a;
  bhdct_insert(tc,(ion_dictionary_t *)(key + 1),local_81,&local_8c,'\x01');
  sprintf(local_81,"k%d",0x49);
  local_90 = 0x30;
  bhdct_insert(tc,(ion_dictionary_t *)(key + 1),local_81,&local_90,'\x01');
  bhdct_takedown(tc,(ion_dictionary_t *)(key + 1));
  return;
}

Assistant:

void
test_bhdct_delete_then_insert_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_edge_cases);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 60);
	bhdct_delete(tc, &dict, key, err_ok, 1, boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 4);
	bhdct_delete(tc, &dict, key, err_ok, 1, boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 505);
	bhdct_delete(tc, &dict, key, err_ok, 1, boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 61);
	bhdct_insert(tc, &dict, key, IONIZE(44, int), boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 67);
	bhdct_insert(tc, &dict, key, IONIZE(42, int), boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 73);
	bhdct_insert(tc, &dict, key, IONIZE(48, int), boolean_true);

	bhdct_takedown(tc, &dict);
}